

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

MultiFileColumnDefinition * __thiscall
duckdb::ParquetReader::ParseColumnDefinition
          (MultiFileColumnDefinition *__return_storage_ptr__,ParquetReader *this,
          FileMetaData *file_meta_data,ParquetColumnSchema *element)

{
  pointer pPVar1;
  const_reference pvVar2;
  idx_t __n;
  pointer element_00;
  MultiFileColumnDefinition local_c8;
  
  MultiFileColumnDefinition::MultiFileColumnDefinition
            (__return_storage_ptr__,&element->name,&element->type);
  if (element->schema_type == FILE_ROW_NUMBER) {
    Value::INTEGER((Value *)&local_c8,0x7ffffffd);
    Value::operator=(&__return_storage_ptr__->identifier,(Value *)&local_c8);
    Value::~Value((Value *)&local_c8);
    return __return_storage_ptr__;
  }
  pvVar2 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                     (&file_meta_data->schema,element->schema_index);
  if (((ushort)pvVar2->__isset & 0x80) == 0) {
    if ((element->parent_schema_index).index == 0xffffffffffffffff) goto LAB_01c7a7ed;
    __n = optional_idx::GetIndex(&element->parent_schema_index);
    pvVar2 = vector<duckdb_parquet::SchemaElement,_true>::operator[](&file_meta_data->schema,__n);
    if (((ushort)pvVar2->__isset & 0x80) == 0) goto LAB_01c7a7ed;
    Value::INTEGER((Value *)&local_c8,pvVar2->field_id);
  }
  else {
    Value::INTEGER((Value *)&local_c8,pvVar2->field_id);
  }
  Value::operator=(&__return_storage_ptr__->identifier,(Value *)&local_c8);
  Value::~Value((Value *)&local_c8);
LAB_01c7a7ed:
  element_00 = (element->children).
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               .
               super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (element->children).
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (element_00 != pPVar1) {
    do {
      ParseColumnDefinition(&local_c8,this,file_meta_data,element_00);
      ::std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::emplace_back<duckdb::MultiFileColumnDefinition>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,&local_c8);
      Value::~Value(&local_c8.identifier);
      if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)
          local_c8.default_expression.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        (*((BaseExpression *)
          local_c8.default_expression.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
          _vptr_BaseExpression[1])();
      }
      local_c8.default_expression.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      ::std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::~vector(&local_c8.children.
                 super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
               );
      LogicalType::~LogicalType(&local_c8.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.name._M_dataplus._M_p != &local_c8.name.field_2) {
        operator_delete(local_c8.name._M_dataplus._M_p);
      }
      element_00 = element_00 + 1;
    } while (element_00 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiFileColumnDefinition ParquetReader::ParseColumnDefinition(const FileMetaData &file_meta_data,
                                                               ParquetColumnSchema &element) {
	MultiFileColumnDefinition result(element.name, element.type);
	if (element.schema_type == ParquetColumnSchemaType::FILE_ROW_NUMBER) {
		result.identifier = Value::INTEGER(MultiFileReader::ORDINAL_FIELD_ID);
		return result;
	}
	auto &column_schema = file_meta_data.schema[element.schema_index];

	if (column_schema.__isset.field_id) {
		result.identifier = Value::INTEGER(column_schema.field_id);
	} else if (element.parent_schema_index.IsValid()) {
		auto &parent_column_schema = file_meta_data.schema[element.parent_schema_index.GetIndex()];
		if (parent_column_schema.__isset.field_id) {
			result.identifier = Value::INTEGER(parent_column_schema.field_id);
		}
	}
	for (auto &child : element.children) {
		result.children.push_back(ParseColumnDefinition(file_meta_data, child));
	}
	return result;
}